

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O0

void __thiscall VpulibDlsym::VpulibDlsym(VpulibDlsym *this)

{
  void *pvVar1;
  _func_RK_S32_VpuCodecContext_ptr_ptr *p_Var2;
  uint local_14;
  RK_U32 i;
  VpulibDlsym *this_local;
  
  this->rkapi_hdl = (void *)0x0;
  this->rkvpu_open_cxt = (_func_RK_S32_VpuCodecContext_ptr_ptr *)0x0;
  this->rkvpu_close_cxt = (_func_RK_S32_VpuCodecContext_ptr_ptr *)0x0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    pvVar1 = (void *)dlopen(codec_paths[local_14],0x101);
    this->rkapi_hdl = pvVar1;
    if (this->rkapi_hdl != (void *)0x0) break;
  }
  if (this->rkapi_hdl != (void *)0x0) {
    p_Var2 = (_func_RK_S32_VpuCodecContext_ptr_ptr *)dlsym(this->rkapi_hdl,"vpu_open_context");
    this->rkvpu_open_cxt = p_Var2;
    p_Var2 = (_func_RK_S32_VpuCodecContext_ptr_ptr *)dlsym(this->rkapi_hdl,"vpu_close_context");
    this->rkvpu_close_cxt = p_Var2;
    _mpp_log_l(4,"vpu_api","dlopen vpu lib %s success\n",0,codec_paths[local_14]);
  }
  return;
}

Assistant:

VpulibDlsym() :
        rkapi_hdl(NULL),
        rkvpu_open_cxt(NULL),
        rkvpu_close_cxt(NULL) {
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(codec_paths); i++) {
            rkapi_hdl = dlopen(codec_paths[i], RTLD_LAZY | RTLD_GLOBAL);
            if (rkapi_hdl)
                break;
        }

        if (rkapi_hdl) {
            rkvpu_open_cxt  = (RK_S32 (*)(VpuCodecContext **ctx))
                              dlsym(rkapi_hdl, "vpu_open_context");
            rkvpu_close_cxt = (RK_S32 (*)(VpuCodecContext **ctx))
                              dlsym(rkapi_hdl, "vpu_close_context");
            mpp_log("dlopen vpu lib %s success\n", codec_paths[i]);
        }
    }